

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  ImGuiViewport *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImRect IVar9;
  
  pIVar3 = GImGui;
  pIVar4 = GetMainViewport();
  fVar1 = (pIVar4->Pos).x;
  fVar2 = (pIVar4->Pos).y;
  fVar6 = (pIVar4->Size).x + fVar1;
  fVar7 = (pIVar4->Size).y + fVar2;
  fVar5 = (pIVar3->Style).DisplaySafeAreaPadding.x;
  fVar8 = (pIVar3->Style).DisplaySafeAreaPadding.y;
  fVar5 = (float)(-(uint)(fVar5 + fVar5 < fVar6 - fVar1) & (uint)-fVar5);
  fVar8 = (float)(-(uint)(fVar8 + fVar8 < fVar7 - fVar2) & (uint)-fVar8);
  IVar9.Min.x = fVar1 - fVar5;
  IVar9.Min.y = fVar2 - fVar8;
  IVar9.Max.x = fVar5 + fVar6;
  IVar9.Max.y = fVar8 + fVar7;
  return IVar9;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}